

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O3

void __thiscall
google::protobuf::io::ConcatenatingInputStream::BackUp(ConcatenatingInputStream *this,int count)

{
  LogMessage *other;
  undefined4 in_register_00000034;
  LogMessage local_50;
  LogFinisher local_11;
  
  if (0 < this->stream_count_) {
    (*(*this->streams_)->_vptr_ZeroCopyInputStream[3])
              (*this->streams_,CONCAT44(in_register_00000034,count));
    return;
  }
  internal::LogMessage::LogMessage
            (&local_50,LOGLEVEL_DFATAL,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/io/zero_copy_stream_impl.cc"
             ,0x150);
  other = internal::LogMessage::operator<<(&local_50,"Can\'t BackUp() after failed Next().");
  internal::LogFinisher::operator=(&local_11,other);
  internal::LogMessage::~LogMessage(&local_50);
  return;
}

Assistant:

void ConcatenatingInputStream::BackUp(int count) {
  if (stream_count_ > 0) {
    streams_[0]->BackUp(count);
  } else {
    GOOGLE_LOG(DFATAL) << "Can't BackUp() after failed Next().";
  }
}